

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::AllocPages<true>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  PageAllocatorBaseCommon *pPVar1;
  HANDLE pVVar2;
  code *pcVar3;
  char *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  BVIndex BVar8;
  uint uVar9;
  BOOL BVar10;
  HANDLE pVVar11;
  AllocatorType *pAVar12;
  undefined4 *puVar13;
  undefined8 *in_FS_OFFSET;
  DWORD local_3c;
  BVIndex BStack_38;
  DWORD oldProtect;
  
  BVar8 = this->freePageCount;
  if (BVar8 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)*in_FS_OFFSET;
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar5) goto LAB_00282de5;
    *puVar13 = 0;
    BVar8 = this->freePageCount;
  }
  this_00 = &this->freePages;
  BVar7 = BVStatic<272UL>::Count(this_00);
  if (BVar8 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)*in_FS_OFFSET;
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar5) goto LAB_00282de5;
    *puVar13 = 0;
  }
  if (pageCount <= this->freePageCount) {
    bVar5 = IsFull(this);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)*in_FS_OFFSET;
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar5) {
LAB_00282de5:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar13 = 0;
    }
    else {
      puVar13 = (undefined4 *)*in_FS_OFFSET;
    }
    BVar8 = BVStatic<272UL>::GetNextBit(this_00,0);
    _BStack_38 = (char *)CONCAT44(oldProtect,BVar8);
    for (; BVar8 != 0xffffffff; BVar8 = BVStatic<272UL>::GetNextBit(this_00,BVar8 + 1)) {
      pPVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
      pAVar12 = &pPVar1[-1].allocatorType;
      if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
        pAVar12 = (AllocatorType *)0x0;
      }
      if (pAVar12[0x28] <= BVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar5) goto LAB_00282de5;
        *puVar13 = 0;
      }
      uVar9 = GetAvailablePageCount(this);
      if (uVar9 - BVar8 < pageCount) {
        return (char *)0x0;
      }
      if (pageCount == 1) {
        BVar8 = BStack_38;
LAB_00282c9f:
        _BStack_38 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                     (BVar8 << 0xc);
        BVStatic<272UL>::ClearRange(this_00,BVar8,pageCount);
        BVar7 = this->freePageCount - pageCount;
        this->freePageCount = BVar7;
        BVar8 = BVStatic<272UL>::Count(this_00);
        if (BVar7 != BVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                             "freePageCount == (uint)this->GetCountOfFreePages()");
          if (!bVar5) goto LAB_00282de5;
          *puVar13 = 0;
        }
        pPVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar12 = &pPVar1[-1].allocatorType;
        if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
          pAVar12 = (AllocatorType *)0x0;
        }
        pVVar2 = *(HANDLE *)(pAVar12 + 0x4a);
        pVVar11 = GetCurrentProcess();
        pcVar4 = _BStack_38;
        if (pVVar2 != pVVar11) {
          return _BStack_38;
        }
        BVar10 = VirtualProtect(_BStack_38,(ulong)(pageCount << 0xc),4,&local_3c);
        if (BVar10 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x180,"((0))","UNREACHED");
          if (bVar5) {
            *puVar13 = 0;
            return (char *)0x0;
          }
        }
        else {
          if (local_3c == 1) {
            return pcVar4;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
          if (bVar5) {
            *puVar13 = 0;
            return pcVar4;
          }
        }
        goto LAB_00282de5;
      }
      BVar6 = BVStatic<272UL>::TestRange(this_00,BVar8,pageCount);
      if (BVar6 != '\0') goto LAB_00282c9f;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}